

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::getEnormousString
          (TestMoreStuffImpl *this,GetEnormousStringContext context)

{
  long *in_RDX;
  PointerBuilder local_88;
  SegmentBuilder *local_70;
  CapTableBuilder *pCStack_68;
  WirePointer *local_60;
  StructBuilder local_58;
  undefined1 local_30;
  
  local_30 = 0;
  (**(code **)(*in_RDX + 0x10))(&local_70);
  local_88.pointer = local_60;
  local_88.segment = local_70;
  local_88.capTable = pCStack_68;
  PointerBuilder::getStruct(&local_58,&local_88,(StructSize)0x10000,(word *)0x0);
  local_88.segment = local_58.segment;
  local_88.capTable = local_58.capTable;
  local_88.pointer = local_58.pointers;
  PointerBuilder::initBlob<capnp::Text>((Builder *)&local_70,&local_88,100000000);
  kj::_::readyNow();
  *(SegmentBuilder **)&this->super_Server = local_58.segment;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::getEnormousString(GetEnormousStringContext context) {
  context.getResults().initStr(100000000);  // 100MB
  return kj::READY_NOW;
}